

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O0

gdImagePtr gdImageRotate180(gdImagePtr src,int ignoretransparent)

{
  int iVar1;
  gdImagePtr to;
  int local_54;
  uint local_50;
  int local_4c;
  int local_48;
  code *pcStack_40;
  int old_blendmode;
  FuncPtr f;
  gdImagePtr dst;
  int a;
  int b;
  int g;
  int r;
  int c;
  int uX;
  int uY;
  int ignoretransparent_local;
  gdImagePtr src_local;
  
  if (src->trueColor == 0) {
    pcStack_40 = gdImageGetPixel;
  }
  else {
    pcStack_40 = gdImageGetTrueColorPixel;
  }
  to = gdImageCreateTrueColor(src->sx,src->sy);
  if (to != (gdImagePtr)0x0) {
    iVar1 = to->alphaBlendingFlag;
    to->alphaBlendingFlag = 0;
    to->transparent = src->transparent;
    gdImagePaletteCopy(to,src);
    for (c = 0; c < src->sy; c = c + 1) {
      for (r = 0; r < src->sx; r = r + 1) {
        g = (*pcStack_40)(src,r,c);
        if (src->trueColor == 0) {
          if (src->trueColor == 0) {
            local_48 = src->red[g];
          }
          else {
            local_48 = (int)(g & 0xff0000U) >> 0x10;
          }
          if (src->trueColor == 0) {
            local_4c = src->green[g];
          }
          else {
            local_4c = (int)(g & 0xff00U) >> 8;
          }
          if (src->trueColor == 0) {
            local_50 = src->blue[g];
          }
          else {
            local_50 = g & 0xff;
          }
          if (src->trueColor == 0) {
            local_54 = src->alpha[g];
          }
          else {
            local_54 = (int)(g & 0x7f000000U) >> 0x18;
          }
          g = local_54 * 0x1000000 + local_48 * 0x10000 + local_4c * 0x100 + local_50;
        }
        if ((ignoretransparent == 0) || (g != to->transparent)) {
          gdImageSetPixel(to,(to->sx - r) + -1,(to->sy - c) + -1,g);
        }
        else {
          gdImageSetPixel(to,(to->sx - r) + -1,(to->sy - c) + -1,to->transparent);
        }
      }
    }
    to->alphaBlendingFlag = iVar1;
  }
  return to;
}

Assistant:

gdImagePtr gdImageRotate180 (gdImagePtr src, int ignoretransparent)
{
	int uY, uX;
	int c,r,g,b,a;
	gdImagePtr dst;
	FuncPtr f;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}
	dst = gdImageCreateTrueColor(src->sx, src->sy);

	if (dst != NULL) {
		int old_blendmode = dst->alphaBlendingFlag;
		dst->alphaBlendingFlag = 0;

		dst->transparent = src->transparent;

		gdImagePaletteCopy (dst, src);

		for (uY = 0; uY<src->sy; uY++) {
			for (uX = 0; uX<src->sx; uX++) {
				c = f (src, uX, uY);
				if (!src->trueColor) {
					r = gdImageRed(src,c);
					g = gdImageGreen(src,c);
					b = gdImageBlue(src,c);
					a = gdImageAlpha(src,c);
					c = gdTrueColorAlpha(r, g, b, a);
				}

				if (ignoretransparent && c == dst->transparent) {
					gdImageSetPixel(dst, (dst->sx - uX - 1), (dst->sy - uY - 1), dst->transparent);
				} else {
					gdImageSetPixel(dst, (dst->sx - uX - 1), (dst->sy - uY - 1), c);
				}
			}
		}
		dst->alphaBlendingFlag = old_blendmode;
	}

	return dst;
}